

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

TagHistoryModePolicy * __thiscall
despot::TagHistoryModePolicy::ComputeMode(TagHistoryModePolicy *this,Belief *belief)

{
  double dVar1;
  int iVar2;
  State *pSVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar4;
  const_reference ppSVar5;
  reference pvVar6;
  long *in_RDX;
  int local_48;
  int i_1;
  int id;
  State *particle;
  int i;
  double maxWeight;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  Belief *belief_local;
  TagHistoryModePolicy *this_local;
  State *mode;
  
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*in_RDX + 0x30))();
  _i = 0.0;
  despot::State::State((State *)this);
  particle._0_4_ = 0;
  while (sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00),
        sVar4 != 0) {
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)(int)particle);
    pSVar3 = *ppSVar5;
    iVar2 = *(int *)(pSVar3 + 0xc);
    dVar1 = *(double *)(pSVar3 + 0x18);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(belief + 0x90),(long)iVar2);
    *pvVar6 = dVar1 + *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(belief + 0x90),(long)iVar2);
    if (_i < *pvVar6) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(belief + 0x90),(long)iVar2);
      _i = *pvVar6;
      State::operator=((State *)this,pSVar3);
      *(value_type *)&this->field_0x18 = _i;
    }
    particle._0_4_ = (int)particle + 1;
  }
  for (local_48 = 0;
      sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00),
      (ulong)(long)local_48 < sVar4; local_48 = local_48 + 1) {
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)local_48);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(belief + 0x90),
                        (long)*(int *)(*ppSVar5 + 0xc));
    *pvVar6 = 0.0;
  }
  return this;
}

Assistant:

State ComputeMode(Belief* belief) const {
		const vector<State*>& particles = static_cast<ParticleBelief*>(belief)->particles();
		double maxWeight = 0;
		State mode;
		for (int i = 0; particles.size(); i++) {
			State* particle = particles[i];
			int id = particle->state_id;
			state_probs_[id] += particle->weight;

			if (state_probs_[id] > maxWeight) {
				maxWeight = state_probs_[id];
				mode = *particle;
				mode.weight = maxWeight;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			state_probs_[particles[i]->state_id] = 0;
		}

		return mode;
	}